

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::WeakZeroDestinationSIVTest
          (LoopDependenceAnalysis *this,SERecurrentNode *source,SENode *destination,
          SENode *coefficient,DistanceEntry *distance_entry)

{
  ScalarEvolutionAnalysis *this_00;
  long lVar1;
  int64_t bound_one;
  int64_t bound_two;
  bool bVar2;
  int iVar3;
  int iVar4;
  Loop *loop;
  SENode *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar7;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  long local_380;
  SENode *local_378;
  SERecurrentNode *local_370;
  SENode *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> local_2a0;
  string local_290;
  string local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Performing WeakZeroDestinationSIVTest.",
             (allocator<char> *)&local_3a0);
  PrintDebug(this,&local_50);
  std::__cxx11::string::_M_dispose();
  local_2a0.first = &source->super_SENode;
  local_2a0.second = destination;
  loop = GetLoopForSubscriptPair(this,&local_2a0);
  local_370 = source;
  pSVar5 = GetConstantTerm(this,loop,source);
  this_00 = &this->scalar_evolution_;
  local_378 = destination;
  pSVar5 = ScalarEvolutionAnalysis::CreateSubtraction(this_00,destination,pSVar5);
  pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar5);
  iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
  local_368 = coefficient;
  iVar4 = (*coefficient->_vptr_SENode[4])(coefficient);
  if (CONCAT44(extraout_var_00,iVar4) == 0 || CONCAT44(extraout_var,iVar3) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "WeakZeroDestinationSIVTest was unable to fold delta and coefficient to constants.",
               (allocator<char> *)&local_3a0);
    PrintDebug(this,&local_f0);
    std::__cxx11::string::_M_dispose();
    local_380 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "WeakZeroDestinationSIVTest folding delta and coefficient to constants.",
               (allocator<char> *)&local_3a0);
    PrintDebug(this,&local_70);
    std::__cxx11::string::_M_dispose();
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar3) + 0x30);
    lVar7 = *(long *)(CONCAT44(extraout_var_00,iVar4) + 0x30);
    if (lVar1 % lVar7 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "WeakZeroDestinationSIVTest proved independence through distance not being an integer."
                 ,(allocator<char> *)&local_3a0);
      PrintDebug(this,&local_90);
      std::__cxx11::string::_M_dispose();
      distance_entry->dependence_information = DIRECTION;
      distance_entry->direction = NONE;
      return true;
    }
    ToString<long>(&local_340,this,lVar1);
    std::operator+(&local_300,
                   "WeakZeroDestinationSIVTest calculated distance with the following values\n\tdelta value: "
                   ,&local_340);
    std::operator+(&local_320,&local_300,"\n\tcoefficient value: ");
    ToString<long>(&local_2c0,this,lVar7);
    std::operator+(&local_2e0,&local_320,&local_2c0);
    std::operator+(&local_360,&local_2e0,"\n\tdistance: ");
    local_380 = lVar1 / lVar7;
    ToString<long>(&local_d0,this,lVar1 / lVar7);
    std::operator+(&local_3a0,&local_360,&local_d0);
    std::operator+(&local_b0,&local_3a0,"\n");
    PrintDebug(this,&local_b0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  pSVar5 = GetLowerBound(this,loop);
  iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
  pSVar5 = GetUpperBound(this,loop);
  iVar4 = (*pSVar5->_vptr_SENode[4])(pSVar5);
  if (CONCAT44(extraout_var_02,iVar4) == 0 || CONCAT44(extraout_var_01,iVar3) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,
               "WeakZeroDestinationSIVTest was unable to find lower and upper bound as SEConstantNodes."
               ,(allocator<char> *)&local_3a0);
    PrintDebug(this,&local_170);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"WeakZeroDestinationSIVTest found bounds as SEConstantNodes.",
               (allocator<char> *)&local_3a0);
    PrintDebug(this,&local_110);
    std::__cxx11::string::_M_dispose();
    lVar1 = local_380;
    bound_one = *(int64_t *)(CONCAT44(extraout_var_01,iVar3) + 0x30);
    bound_two = *(int64_t *)(CONCAT44(extraout_var_02,iVar4) + 0x30);
    lVar7 = -local_380;
    if (0 < local_380) {
      lVar7 = local_380;
    }
    bVar2 = IsWithinBounds(this,lVar7,bound_one,bound_two);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "WeakZeroDestinationSIVTest proved independence through distance escaping the loop bounds."
                 ,(allocator<char> *)&local_3a0);
      PrintDebug(this,&local_130);
      std::__cxx11::string::_M_dispose();
      ToString<long>(&local_300,this,bound_one);
      std::operator+(&local_320,"Bound values were as follows\n\tlower bound value: ",&local_300);
      std::operator+(&local_2e0,&local_320,"\n\tupper bound value: ");
      ToString<long>(&local_340,this,bound_two);
      std::operator+(&local_360,&local_2e0,&local_340);
      std::operator+(&local_3a0,&local_360,"\n\tdistance value: ");
      ToString<long>(&local_2c0,this,lVar1);
      std::operator+(&local_150,&local_3a0,&local_2c0);
      PrintDebug(this,&local_150);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      distance_entry->dependence_information = DISTANCE;
      distance_entry->direction = NONE;
      distance_entry->distance = lVar1;
      return true;
    }
  }
  pSVar5 = GetFirstTripInductionNode(this,loop);
  pSVar6 = GetConstantTerm(this,loop,local_370);
  pSVar5 = ScalarEvolutionAnalysis::CreateAddNode(this_00,pSVar5,pSVar6);
  pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar5);
  if (pSVar5 == (SENode *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,
               "WeakZeroDestinationSIVTest was unable to build first_trip_SENode",
               (allocator<char> *)&local_3a0);
    PrintDebug(this,&local_1f0);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"WeakZeroDestinationSIVTest built first_trip_SENode.",
               (allocator<char> *)&local_3a0);
    PrintDebug(this,&local_190);
    std::__cxx11::string::_M_dispose();
    iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
    if (CONCAT44(extraout_var_03,iVar3) != 0) {
      iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
      ToString<long>(&local_360,this,*(long *)(CONCAT44(extraout_var_04,iVar3) + 0x30));
      std::operator+(&local_3a0,
                     "WeakZeroDestinationSIVTest has found first_trip_SENode as an SEConstantNode with value: "
                     ,&local_360);
      std::operator+(&local_1b0,&local_3a0,"\n");
      PrintDebug(this,&local_1b0);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    if (pSVar5 == local_378) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,
                 "WeakZeroDestinationSIVTest has found peeling first iteration will break dependency"
                 ,(allocator<char> *)&local_3a0);
      PrintDebug(this,&local_1d0);
      std::__cxx11::string::_M_dispose();
      distance_entry->dependence_information = PEEL;
      distance_entry->peel_first = true;
      return false;
    }
  }
  pSVar5 = GetFinalTripInductionNode(this,loop,local_368);
  pSVar6 = GetConstantTerm(this,loop,local_370);
  pSVar5 = ScalarEvolutionAnalysis::CreateAddNode(this_00,pSVar5,pSVar6);
  pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar5);
  if (pSVar5 == (SENode *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "WeakZeroDestinationSIVTest was unable to build final_trip_SENode",
               (allocator<char> *)&local_3a0);
    PrintDebug(this,&local_270);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"WeakZeroDestinationSIVTest built final_trip_SENode.",
               (allocator<char> *)&local_3a0);
    PrintDebug(this,&local_210);
    std::__cxx11::string::_M_dispose();
    iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
    if (CONCAT44(extraout_var_05,iVar3) != 0) {
      iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
      ToString<long>(&local_360,this,*(long *)(CONCAT44(extraout_var_06,iVar3) + 0x30));
      std::operator+(&local_3a0,
                     "WeakZeroDestinationSIVTest has found final_trip_SENode as an SEConstantNode with value: "
                     ,&local_360);
      std::operator+(&local_230,&local_3a0,"\n");
      PrintDebug(this,&local_230);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    if (pSVar5 == local_378) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,
                 "WeakZeroDestinationSIVTest has found peeling final iteration will break dependency"
                 ,(allocator<char> *)&local_3a0);
      PrintDebug(this,&local_250);
      std::__cxx11::string::_M_dispose();
      distance_entry->dependence_information = PEEL;
      distance_entry->peel_last = true;
      return false;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "WeakZeroDestinationSIVTest was unable to determine any dependence information.",
             (allocator<char> *)&local_3a0);
  PrintDebug(this,&local_290);
  std::__cxx11::string::_M_dispose();
  distance_entry->direction = ALL;
  return false;
}

Assistant:

bool LoopDependenceAnalysis::WeakZeroDestinationSIVTest(
    SERecurrentNode* source, SENode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing WeakZeroDestinationSIVTest.");
  // Build an SENode for distance.
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  SENode* source_constant_term = GetConstantTerm(subscript_loop, source);
  SENode* delta = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateSubtraction(destination, source_constant_term));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  int64_t distance = 0;
  SEConstantNode* delta_constant = delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    PrintDebug(
        "WeakZeroDestinationSIVTest folding delta and coefficient to "
        "constants.");
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    // Check if the distance is not integral.
    if (delta_value % coefficient_value != 0) {
      PrintDebug(
          "WeakZeroDestinationSIVTest proved independence through distance not "
          "being an integer.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / coefficient_value;
      PrintDebug(
          "WeakZeroDestinationSIVTest calculated distance with the following "
          "values\n"
          "\tdelta value: " +
          ToString(delta_value) +
          "\n\tcoefficient value: " + ToString(coefficient_value) +
          "\n\tdistance: " + ToString(distance) + "\n");
    }
  } else {
    PrintDebug(
        "WeakZeroDestinationSIVTest was unable to fold delta and coefficient "
        "to constants.");
  }

  // If we can prove the distance is outside the bounds we prove independence.
  SEConstantNode* lower_bound =
      GetLowerBound(subscript_loop)->AsSEConstantNode();
  SEConstantNode* upper_bound =
      GetUpperBound(subscript_loop)->AsSEConstantNode();
  if (lower_bound && upper_bound) {
    PrintDebug("WeakZeroDestinationSIVTest found bounds as SEConstantNodes.");
    int64_t lower_bound_value = lower_bound->FoldToSingleValue();
    int64_t upper_bound_value = upper_bound->FoldToSingleValue();
    if (!IsWithinBounds(llabs(distance), lower_bound_value,
                        upper_bound_value)) {
      PrintDebug(
          "WeakZeroDestinationSIVTest proved independence through distance "
          "escaping the loop bounds.");
      PrintDebug(
          "Bound values were as follows\n"
          "\tlower bound value: " +
          ToString(lower_bound_value) +
          "\n\tupper bound value: " + ToString(upper_bound_value) +
          "\n\tdistance value: " + ToString(distance));
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DISTANCE;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      distance_entry->distance = distance;
      return true;
    }
  } else {
    PrintDebug(
        "WeakZeroDestinationSIVTest was unable to find lower and upper bound "
        "as SEConstantNodes.");
  }

  // Now we want to see if we can detect to peel the first or last iterations.

  // We get the FirstTripValue as GetFirstTripInductionNode() +
  // GetConstantTerm(source)
  SENode* first_trip_SENode = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateAddNode(GetFirstTripInductionNode(subscript_loop),
                                      GetConstantTerm(subscript_loop, source)));

  // If destination == FirstTripValue, peel_first.
  if (first_trip_SENode) {
    PrintDebug("WeakZeroDestinationSIVTest built first_trip_SENode.");
    if (first_trip_SENode->AsSEConstantNode()) {
      PrintDebug(
          "WeakZeroDestinationSIVTest has found first_trip_SENode as an "
          "SEConstantNode with value: " +
          ToString(first_trip_SENode->AsSEConstantNode()->FoldToSingleValue()) +
          "\n");
    }
    if (destination == first_trip_SENode) {
      // We have found that peeling the first iteration will break dependency.
      PrintDebug(
          "WeakZeroDestinationSIVTest has found peeling first iteration will "
          "break dependency");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::PEEL;
      distance_entry->peel_first = true;
      return false;
    }
  } else {
    PrintDebug(
        "WeakZeroDestinationSIVTest was unable to build first_trip_SENode");
  }

  // We get the LastTripValue as GetFinalTripInductionNode(coefficient) +
  // GetConstantTerm(source)
  SENode* final_trip_SENode =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
          GetFinalTripInductionNode(subscript_loop, coefficient),
          GetConstantTerm(subscript_loop, source)));

  // If destination == LastTripValue, peel_last.
  if (final_trip_SENode) {
    PrintDebug("WeakZeroDestinationSIVTest built final_trip_SENode.");
    if (final_trip_SENode->AsSEConstantNode()) {
      PrintDebug(
          "WeakZeroDestinationSIVTest has found final_trip_SENode as an "
          "SEConstantNode with value: " +
          ToString(final_trip_SENode->AsSEConstantNode()->FoldToSingleValue()) +
          "\n");
    }
    if (destination == final_trip_SENode) {
      // We have found that peeling the last iteration will break dependency.
      PrintDebug(
          "WeakZeroDestinationSIVTest has found peeling final iteration will "
          "break dependency");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::PEEL;
      distance_entry->peel_last = true;
      return false;
    }
  } else {
    PrintDebug(
        "WeakZeroDestinationSIVTest was unable to build final_trip_SENode");
  }

  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "WeakZeroDestinationSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}